

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::parent_path(path *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  path *ppVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  reference pcVar6;
  format fmt;
  path *in_RDI;
  const_iterator iter;
  iterator piter;
  size_type rootPathLen;
  path *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  path *in_stack_ffffffffffffff28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  path *in_stack_ffffffffffffff30;
  const_iterator *in_stack_ffffffffffffff60;
  iterator *in_stack_ffffffffffffff68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [9];
  ulong local_18;
  
  ppVar5 = in_RDI;
  sVar3 = root_name_length(in_stack_ffffffffffffff28);
  bVar1 = has_root_directory(in_stack_ffffffffffffff30);
  local_18 = sVar3 + (long)(int)(uint)bVar1;
  uVar4 = std::__cxx11::string::length();
  if (sVar3 + (long)(int)(uint)bVar1 < uVar4) {
    bVar1 = empty((path *)0x2882df);
    if (bVar1) {
      path((path *)0x2882ef);
    }
    else {
      this_00 = local_60;
      end(ppVar5);
      std::__cxx11::string::end();
      local_68._M_current =
           (char *)iterator::decrement(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      ppVar5 = (path *)std::__cxx11::string::begin();
      last = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(this_00,CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      bVar2 = __gnu_cxx::operator>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff18);
      bVar1 = false;
      if (bVar2) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        bVar1 = *pcVar6 != '/';
      }
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(&local_68);
      }
      std::__cxx11::string::begin();
      path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (ppVar5,in_stack_ffffffffffffff80,last,fmt);
      iterator::~iterator((iterator *)0x288418);
    }
  }
  else {
    path((path *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
         in_stack_ffffffffffffff18);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}